

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsseval.c
# Opt level: O1

void GEN(AES_KEY *key,int alpha,int n,uchar **k0,uchar **k1)

{
  ulong *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  ulong uVar6;
  undefined8 uVar7;
  longlong lVar8;
  undefined8 uVar9;
  longlong lVar10;
  undefined8 uVar11;
  uint uVar12;
  uint *puVar13;
  uchar *puVar14;
  uchar *puVar15;
  uchar *puVar16;
  uint uVar17;
  ulong uVar18;
  undefined8 *puVar19;
  longlong *plVar20;
  block *palVar21;
  longlong *plVar22;
  AES_KEY *pAVar23;
  long lVar24;
  undefined1 (*pauVar25) [16];
  undefined4 in_register_00000034;
  undefined8 *puVar26;
  AES_KEY *pAVar27;
  ulong uVar28;
  long lVar29;
  uint *puVar30;
  uint uVar31;
  ulong uVar32;
  size_t __size;
  bool bVar33;
  undefined8 extraout_XMM0_Qa;
  ulong uVar34;
  longlong extraout_XMM0_Qb;
  undefined1 extraout_XMM0 [16];
  ulong uVar38;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar39 [16];
  block input;
  block input_00;
  block input_01;
  undefined8 uStack_110;
  undefined8 uStack_108;
  block s0 [2];
  block s1 [2];
  uint local_a8;
  uint uStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  uint local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint local_50;
  uint local_4c;
  int t0 [2];
  int aiStack_40 [2];
  uint local_38;
  uint local_34;
  int t1 [2];
  
  puVar26 = (undefined8 *)CONCAT44(in_register_00000034,alpha);
  t0[0] = alpha;
  uVar18 = (ulong)(n - 7U);
  uVar28 = (ulong)(n - 6);
  pauVar25 = (undefined1 (*) [16])(&uStack_108 + uVar28 * -4);
  uVar32 = uVar28 * 8 + 0xf & 0xfffffffffffffff0;
  puVar30 = (uint *)((long)pauVar25 - uVar32);
  puVar19 = (undefined8 *)
            ((long)puVar30 + (uVar18 * -0x10 - (uVar18 * 8 + 0xf & 0xfffffffffffffff0)));
  puVar19[-1] = 0x101409;
  pAVar27 = key;
  dpf_random_block();
  *(undefined8 *)*pauVar25 = extraout_XMM0_Qa;
  s0[uVar28 * -2][0] = extraout_XMM0_Qb;
  puVar19[-1] = 0x101412;
  dpf_random_block();
  *(undefined1 (*) [16])(s0[uVar28 * -2] + 1) = extraout_XMM0;
  uVar12 = (byte)(*pauVar25)[0] & 1;
  *puVar30 = uVar12;
  *(uint *)((long)s0 + (uVar28 * -0x20 - uVar32) + -4) = uVar12 ^ 1;
  auVar39 = *pauVar25;
  if ((auVar39 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    auVar39 = auVar39 ^ _DAT_00103010;
  }
  *(undefined1 (*) [16])(&uStack_108 + uVar28 * -4) = auVar39;
  auVar39 = extraout_XMM0;
  if ((extraout_XMM0 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    auVar39 = extraout_XMM0 ^ _DAT_00103010;
  }
  *(undefined1 (*) [16])(s0[uVar28 * -2] + 1) = auVar39;
  if (7 < n) {
    lVar29 = 0;
    uVar31 = n;
    do {
      uVar31 = uVar31 - 1;
      palVar21 = (block *)&local_50;
      puVar19[-1] = 0x1014c1;
      input[1] = (longlong)(s0[0] + 1);
      input[0] = (longlong)&uStack_108;
      PRG(key,input,palVar21,(block *)&local_4c,(int *)palVar21,(int *)*puVar19);
      puVar19[-1] = 0x1014e8;
      input_00[1] = (longlong)(s1[0] + 1);
      input_00[0] = (longlong)(s0[1] + 1);
      PRG(key,input_00,(block *)&local_38,(block *)&local_34,(int *)palVar21,(int *)*puVar19);
      bVar33 = ((uint)t0[0] >> (uVar31 & 0x1f) & 1) != 0;
      uVar32 = (ulong)bVar33;
      plVar20 = &uStack_108;
      if (!bVar33) {
        plVar20 = s0[0] + 1;
      }
      plVar22 = s0[1] + 1;
      if (!bVar33) {
        plVar22 = s1[0] + 1;
      }
      uVar34 = *plVar22 ^ *plVar20;
      uVar38 = plVar22[1] ^ plVar20[1];
      plVar20 = s0[0] + 1;
      if (!bVar33) {
        plVar20 = &uStack_108;
      }
      puVar1 = (ulong *)((long)puVar30 + lVar29 * 2 + uVar18 * -0x10);
      *puVar1 = uVar34;
      puVar1[1] = uVar38;
      *(uint *)((long)puVar19 + lVar29) = local_50 ^ local_38 ^ (uint)bVar33 ^ 1;
      *(uint *)((long)puVar19 + lVar29 + 4) = local_4c ^ local_34 ^ (uint)bVar33;
      uVar5 = plVar20[1];
      if (*(int *)((long)puVar30 + lVar29) == 1) {
        puVar1 = (ulong *)((long)s1[uVar28 * -2 + -1] + lVar29 * 4 + 8);
        *puVar1 = *plVar20 ^ uVar34;
        puVar1[1] = uVar5 ^ uVar38;
        palVar21 = (block *)&local_4c;
        if (uVar32 == 0) {
          palVar21 = (block *)&local_50;
        }
        uVar17 = (uint)(*palVar21)[0] ^ *(uint *)((long)puVar19 + lVar29 + uVar32 * 4);
      }
      else {
        puVar1 = (ulong *)((long)s1[uVar28 * -2 + -1] + lVar29 * 4 + 8);
        *puVar1 = *plVar20;
        puVar1[1] = uVar5;
        palVar21 = (block *)&local_4c;
        if (uVar32 == 0) {
          palVar21 = (block *)&local_50;
        }
        uVar17 = (uint)(*palVar21)[0];
      }
      pAVar27 = (AES_KEY *)(s0[1] + 1);
      pAVar23 = (AES_KEY *)(s1[0] + 1);
      if (uVar32 == 0) {
        pAVar23 = pAVar27;
      }
      *(uint *)((long)puVar30 + lVar29 + 8) = uVar17;
      uVar5 = pAVar23->rd_key[0][0];
      uVar6 = pAVar23->rd_key[0][1];
      if (*(int *)((long)puVar30 + lVar29 + 4) == 1) {
        puVar1 = (ulong *)((long)s1[uVar28 * -2] + lVar29 * 4 + 8);
        *puVar1 = uVar5 ^ uVar34;
        puVar1[1] = uVar6 ^ uVar38;
        puVar13 = &local_34;
        if (uVar32 == 0) {
          puVar13 = &local_38;
        }
        uVar17 = *puVar13 ^ *(uint *)((long)puVar19 + lVar29 + uVar32 * 4);
      }
      else {
        puVar1 = (ulong *)((long)s1[uVar28 * -2] + lVar29 * 4 + 8);
        *puVar1 = uVar5;
        puVar1[1] = uVar6;
        puVar13 = &local_34;
        if (uVar32 == 0) {
          puVar13 = &local_38;
        }
        uVar17 = *puVar13;
      }
      *(uint *)((long)puVar30 + lVar29 + 0xc) = uVar17;
      lVar29 = lVar29 + 8;
      puVar26 = puVar19;
    } while (uVar28 * 8 + -8 != lVar29);
  }
  auVar39 = ZEXT416(1);
  if (((ulong)t0 & 0x40) != 0) {
    auVar39 = _DAT_00103020;
  }
  if (((ulong)t0 & 0x20) != 0) {
    lVar29 = auVar39._8_8_;
    auVar39._0_8_ = auVar39._0_8_ << 0x20;
    auVar39._8_8_ = lVar29 << 0x20;
  }
  if (((ulong)t0 & 0x10) != 0) {
    lVar29 = auVar39._8_8_;
    uVar32 = auVar39._0_8_;
    auVar39._0_8_ = uVar32 << 0x10;
    auVar39._8_8_ = lVar29 << 0x10 | uVar32 >> 0x30;
  }
  if (((ulong)t0 & 8) != 0) {
    lVar29 = auVar39._8_8_;
    uVar32 = auVar39._0_8_;
    auVar39._0_8_ = uVar32 << 8;
    auVar39._8_8_ = lVar29 << 8 | uVar32 >> 0x38;
  }
  if (((ulong)t0 & 4) != 0) {
    auVar35._0_8_ = auVar39._0_8_ << 4;
    auVar35._8_8_ = auVar39._8_8_ << 4;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = auVar39._0_8_ >> 0x3c;
    auVar39 = auVar35 | auVar2 << 0x40;
  }
  if (((ulong)t0 & 2) != 0) {
    auVar36._0_8_ = auVar39._0_8_ << 2;
    auVar36._8_8_ = auVar39._8_8_ << 2;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = auVar39._0_8_ >> 0x3e;
    auVar39 = auVar36 | auVar3 << 0x40;
  }
  if (((ulong)t0 & 1) != 0) {
    auVar37._8_8_ = auVar39._8_8_ * 2;
    auVar37._0_8_ = auVar39._0_8_ * 2;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = auVar39._0_8_ >> 0x3f;
    auVar39 = auVar37 | auVar4 << 0x40;
  }
  puVar19[-1] = 0x1016b3;
  input_01[1] = (longlong)puVar26;
  input_01[0] = (longlong)pAVar27;
  dpf_cb(input_01);
  lVar29 = (long)(int)(n - 7U);
  uVar7 = *(undefined8 *)(pauVar25[lVar29 * 2] + 8);
  t0 = *(int (*) [2])pauVar25[lVar29 * 2];
  lVar8 = s0[uVar28 * -2 + lVar29 * 2][1];
  uVar9 = (s0[uVar28 * -2 + lVar29 * 2] + 1)[1];
  lVar29 = lVar29 * 0x12;
  __size = (size_t)((int)lVar29 + 0x22);
  puVar19[-1] = 0x1016ec;
  puVar14 = (uchar *)malloc(__size);
  puVar19[-1] = 0x1016f7;
  puVar15 = (uchar *)malloc(__size);
  if ((puVar14 != (uchar *)0x0) && (puVar15 != (uchar *)0x0)) {
    *puVar14 = (uchar)n;
    lVar10 = s0[uVar28 * -2][0];
    *(undefined8 *)(puVar14 + 1) = *(undefined8 *)*pauVar25;
    *(longlong *)(puVar14 + 9) = lVar10;
    puVar14[0x11] = (uchar)uVar12;
    if (7 < n) {
      puVar16 = puVar14 + 0x23;
      lVar24 = 0;
      do {
        puVar26 = (undefined8 *)((long)puVar30 + lVar24 * 2 + uVar18 * -0x10);
        uVar11 = puVar26[1];
        *(undefined8 *)(puVar16 + -0x11) = *puVar26;
        *(undefined8 *)(puVar16 + -9) = uVar11;
        puVar16[-1] = *(uchar *)((long)puVar19 + lVar24);
        *puVar16 = *(uchar *)((long)puVar19 + lVar24 + 4);
        puVar16 = puVar16 + 0x12;
        lVar24 = lVar24 + 8;
      } while (uVar28 * 8 + -8 != lVar24);
    }
    aiStack_40[0] = (int)uVar7;
    aiStack_40[1] = (int)((ulong)uVar7 >> 0x20);
    local_98 = (uint)lVar8;
    uStack_94 = (uint)((ulong)lVar8 >> 0x20);
    uStack_90 = (uint)uVar9;
    uStack_8c = (uint)((ulong)uVar9 >> 0x20);
    local_a8 = auVar39._0_4_;
    uStack_a4 = auVar39._4_4_;
    uStack_a0 = auVar39._8_4_;
    uStack_9c = auVar39._12_4_;
    local_a8 = t0[0] ^ local_98 ^ local_a8;
    uStack_a4 = t0[1] ^ uStack_94 ^ uStack_a4;
    aiStack_40[0] = aiStack_40[0] ^ uStack_90 ^ uStack_a0;
    aiStack_40[1] = aiStack_40[1] ^ uStack_8c ^ uStack_9c;
    t0 = (int  [2])(CONCAT44(uStack_a4,local_a8) ^ 1);
    puVar30 = (uint *)(puVar14 + lVar29 + 0x12);
    *puVar30 = local_a8 ^ 1;
    puVar30[1] = uStack_a4;
    puVar30[2] = aiStack_40[0];
    puVar30[3] = aiStack_40[1];
    *puVar15 = (uchar)n;
    puVar19[-1] = 0x1017aa;
    memcpy(puVar15 + 0x12,puVar14 + 0x12,(long)(int)lVar29);
    lVar8 = s0[uVar28 * -2 + 1][0];
    *(longlong *)(puVar15 + 1) = s0[uVar28 * -2][1];
    *(longlong *)(puVar15 + 9) = lVar8;
    puVar15[0x11] = (uchar)(uVar12 ^ 1);
    *(int (*) [2])(puVar15 + lVar29 + 0x12) = t0;
    ((int (*) [2])(puVar15 + lVar29 + 0x12))[1] = aiStack_40;
    *k0 = puVar14;
    *k1 = puVar15;
    return;
  }
  puVar19[-1] = 0x1017f2;
  puts("Memory allocation failed");
  puVar19[-1] = EVAL;
  exit(1);
}

Assistant:

void GEN(AES_KEY *key, int alpha, int n, unsigned char** k0, unsigned char **k1){
	int maxlayer = n - 7;
	//int maxlayer = n;

	block s[maxlayer + 1][2];
	int t[maxlayer + 1 ][2];
	block sCW[maxlayer];
	int tCW[maxlayer][2];

	s[0][0] = dpf_random_block();
	s[0][1] = dpf_random_block();
	t[0][0] = dpf_lsb(s[0][0]);
	t[0][1] = t[0][0] ^ 1;
	s[0][0] = dpf_set_lsb_zero(s[0][0]);
	s[0][1] = dpf_set_lsb_zero(s[0][1]);

	int i;
	block s0[2], s1[2]; // 0=L,1=R
	#define LEFT 0
	#define RIGHT 1
	int t0[2], t1[2];
	for(i = 1; i<= maxlayer; i++){
		PRG(key, s[i-1][0], &s0[LEFT], &s0[RIGHT], &t0[LEFT], &t0[RIGHT]);
		PRG(key, s[i-1][1], &s1[LEFT], &s1[RIGHT], &t1[LEFT], &t1[RIGHT]);

		int keep, lose;
		int alphabit = getbit(alpha, n, i);
		if(alphabit == 0){
			keep = LEFT;
			lose = RIGHT;
		}else{
			keep = RIGHT;
			lose = LEFT;
		}

		sCW[i-1] = dpf_xor(s0[lose], s1[lose]);

		tCW[i-1][LEFT] = t0[LEFT] ^ t1[LEFT] ^ alphabit ^ 1;
		tCW[i-1][RIGHT] = t0[RIGHT] ^ t1[RIGHT] ^ alphabit;

		if(t[i-1][0] == 1){
			s[i][0] = dpf_xor(s0[keep], sCW[i-1]);
			t[i][0] = t0[keep] ^ tCW[i-1][keep];
		}else{
			s[i][0] = s0[keep];
			t[i][0] = t0[keep];
		}

		if(t[i-1][1] == 1){
			s[i][1] = dpf_xor(s1[keep], sCW[i-1]);
			t[i][1] = t1[keep] ^ tCW[i-1][keep];
		}else{
			s[i][1] = s1[keep];
			t[i][1] = t1[keep];
		}
	}

	block finalblock;
	finalblock = dpf_zero_block();
	finalblock = dpf_reverse_lsb(finalblock);

	char shift = (alpha) & 127;
	if(shift & 64){
		finalblock = dpf_left_shirt(finalblock, 64);
	}
	if(shift & 32){
		finalblock = dpf_left_shirt(finalblock, 32);
	}
	if(shift & 16){
		finalblock = dpf_left_shirt(finalblock, 16);
	}
	if(shift & 8){
		finalblock = dpf_left_shirt(finalblock, 8);
	}
	if(shift & 4){
		finalblock = dpf_left_shirt(finalblock, 4);
	}
	if(shift & 2){
		finalblock = dpf_left_shirt(finalblock, 2);
	}
	if(shift & 1){
		finalblock = dpf_left_shirt(finalblock, 1);
	}
	dpf_cb(finalblock);
	finalblock = dpf_reverse_lsb(finalblock);

	finalblock = dpf_xor(finalblock, s[maxlayer][0]);
	finalblock = dpf_xor(finalblock, s[maxlayer][1]);

	unsigned char *buff0;
	unsigned char *buff1;
	buff0 = (unsigned char*) malloc(1 + 16 + 1 + 18 * maxlayer + 16);
	buff1 = (unsigned char*) malloc(1 + 16 + 1 + 18 * maxlayer + 16);

	if(buff0 == NULL || buff1 == NULL){
		printf("Memory allocation failed\n");
		exit(1);
	}

	buff0[0] = n;
	memcpy(&buff0[1], &s[0][0], 16);
	buff0[17] = t[0][0];
	for(i = 1; i <= maxlayer; i++){
		memcpy(&buff0[18 * i], &sCW[i-1], 16);
		buff0[18 * i + 16] = tCW[i-1][0];
		buff0[18 * i + 17] = tCW[i-1][1]; 
	}
	memcpy(&buff0[18 * maxlayer + 18], &finalblock, 16); 

	buff1[0] = n;
	memcpy(&buff1[18], &buff0[18], 18 * (maxlayer));
	memcpy(&buff1[1], &s[0][1], 16);
	buff1[17] = t[0][1];
	memcpy(&buff1[18 * maxlayer + 18], &finalblock, 16);

	*k0 = buff0;
	*k1 = buff1;
}